

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_auth_act(connectdata *conn)

{
  Curl_easy *data_00;
  int iVar1;
  char *pcVar2;
  unsigned_long local_30;
  unsigned_long authmask;
  CURLcode result;
  _Bool pickproxy;
  _Bool pickhost;
  Curl_easy *data;
  connectdata *conn_local;
  
  data_00 = conn->data;
  authmask._7_1_ = false;
  authmask._6_1_ = false;
  authmask._0_4_ = CURLE_OK;
  local_30 = 0xffffffffffffffff;
  if ((data_00->set).str[0x41] == (char *)0x0) {
    local_30 = 0xffffffffffffffbf;
  }
  if (((data_00->req).httpcode < 100) || (199 < (data_00->req).httpcode)) {
    if ((*(ushort *)&(data_00->state).field_0x514 >> 5 & 1) == 0) {
      if ((((*(uint *)&(conn->bits).field_0x4 >> 8 & 1) != 0) ||
          ((data_00->set).str[0x41] != (char *)0x0)) &&
         (((data_00->req).httpcode == 0x191 ||
          (((*(uint *)&(conn->bits).field_0x4 >> 0x10 & 1) != 0 && ((data_00->req).httpcode < 300)))
          ))) {
        authmask._7_1_ = pickoneauth(&(data_00->state).authhost,local_30);
        if (!authmask._7_1_) {
          *(ushort *)&(data_00->state).field_0x514 =
               *(ushort *)&(data_00->state).field_0x514 & 0xffdf | 0x20;
        }
        if (((data_00->state).authhost.picked == 8) && (0xb < conn->httpversion)) {
          Curl_infof(data_00,"Forcing HTTP/1.1 for NTLM");
          Curl_conncontrol(conn,1);
          (conn->data->set).httpversion = 2;
        }
      }
      if ((((*(uint *)&(conn->bits).field_0x4 >> 9 & 1) != 0) &&
          (((data_00->req).httpcode == 0x197 ||
           (((*(uint *)&(conn->bits).field_0x4 >> 0x10 & 1) != 0 && ((data_00->req).httpcode < 300))
           )))) && (authmask._6_1_ =
                         pickoneauth(&(data_00->state).authproxy,local_30 & 0xffffffffffffffbf),
                   !authmask._6_1_)) {
        *(ushort *)&(data_00->state).field_0x514 =
             *(ushort *)&(data_00->state).field_0x514 & 0xffdf | 0x20;
      }
      if ((authmask._7_1_ == false) && (authmask._6_1_ == false)) {
        if ((((data_00->req).httpcode < 300) && (((data_00->state).authhost.field_0x18 & 1) == 0))
           && (((*(uint *)&(conn->bits).field_0x4 >> 0x10 & 1) != 0 &&
               (((data_00->set).httpreq != HTTPREQ_GET && ((data_00->set).httpreq != HTTPREQ_HEAD)))
               ))) {
          pcVar2 = (*Curl_cstrdup)((data_00->change).url);
          (data_00->req).newurl = pcVar2;
          if ((data_00->req).newurl == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
          (data_00->state).authhost.field_0x18 = (data_00->state).authhost.field_0x18 & 0xfe | 1;
        }
      }
      else {
        if (((data_00->set).httpreq != HTTPREQ_GET) &&
           ((((data_00->set).httpreq != HTTPREQ_HEAD &&
             ((*(uint *)&(conn->bits).field_0x4 >> 0x11 & 1) == 0)) &&
            (authmask._0_4_ = http_perhapsrewind(conn), (CURLcode)authmask != CURLE_OK)))) {
          return (CURLcode)authmask;
        }
        (*Curl_cfree)((data_00->req).newurl);
        (data_00->req).newurl = (char *)0x0;
        pcVar2 = (*Curl_cstrdup)((data_00->change).url);
        (data_00->req).newurl = pcVar2;
        if ((data_00->req).newurl == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
      }
      iVar1 = http_should_fail(conn);
      if (iVar1 != 0) {
        Curl_failf(data_00,"The requested URL returned error: %d",
                   (ulong)(uint)(data_00->req).httpcode);
        authmask._0_4_ = CURLE_HTTP_RETURNED_ERROR;
      }
      conn_local._4_4_ = (CURLcode)authmask;
    }
    else {
      conn_local._4_4_ = CURLE_OK;
      if ((*(ulong *)&(data_00->set).field_0x8e8 >> 0x14 & 1) != 0) {
        conn_local._4_4_ = CURLE_HTTP_RETURNED_ERROR;
      }
    }
  }
  else {
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_http_auth_act(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;
  bool pickhost = FALSE;
  bool pickproxy = FALSE;
  CURLcode result = CURLE_OK;
  unsigned long authmask = ~0ul;

  if(!data->set.str[STRING_BEARER])
    authmask &= (unsigned long)~CURLAUTH_BEARER;

  if(100 <= data->req.httpcode && 199 >= data->req.httpcode)
    /* this is a transient response code, ignore */
    return CURLE_OK;

  if(data->state.authproblem)
    return data->set.http_fail_on_error?CURLE_HTTP_RETURNED_ERROR:CURLE_OK;

  if((conn->bits.user_passwd || data->set.str[STRING_BEARER]) &&
     ((data->req.httpcode == 401) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickhost = pickoneauth(&data->state.authhost, authmask);
    if(!pickhost)
      data->state.authproblem = TRUE;
    if(data->state.authhost.picked == CURLAUTH_NTLM &&
       conn->httpversion > 11) {
      infof(data, "Forcing HTTP/1.1 for NTLM");
      connclose(conn, "Force HTTP/1.1 connection");
      conn->data->set.httpversion = CURL_HTTP_VERSION_1_1;
    }
  }
  if(conn->bits.proxy_user_passwd &&
     ((data->req.httpcode == 407) ||
      (conn->bits.authneg && data->req.httpcode < 300))) {
    pickproxy = pickoneauth(&data->state.authproxy,
                            authmask & ~CURLAUTH_BEARER);
    if(!pickproxy)
      data->state.authproblem = TRUE;
  }

  if(pickhost || pickproxy) {
    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD) &&
       !conn->bits.rewindaftersend) {
      result = http_perhapsrewind(conn);
      if(result)
        return result;
    }
    /* In case this is GSS auth, the newurl field is already allocated so
       we must make sure to free it before allocating a new one. As figured
       out in bug #2284386 */
    Curl_safefree(data->req.newurl);
    data->req.newurl = strdup(data->change.url); /* clone URL */
    if(!data->req.newurl)
      return CURLE_OUT_OF_MEMORY;
  }
  else if((data->req.httpcode < 300) &&
          (!data->state.authhost.done) &&
          conn->bits.authneg) {
    /* no (known) authentication available,
       authentication is not "done" yet and
       no authentication seems to be required and
       we didn't try HEAD or GET */
    if((data->set.httpreq != HTTPREQ_GET) &&
       (data->set.httpreq != HTTPREQ_HEAD)) {
      data->req.newurl = strdup(data->change.url); /* clone URL */
      if(!data->req.newurl)
        return CURLE_OUT_OF_MEMORY;
      data->state.authhost.done = TRUE;
    }
  }
  if(http_should_fail(conn)) {
    failf(data, "The requested URL returned error: %d",
          data->req.httpcode);
    result = CURLE_HTTP_RETURNED_ERROR;
  }

  return result;
}